

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astr.c
# Opt level: O2

void print_escaped_astr(FILE *out,astr *astr)

{
  byte bVar1;
  ulong uVar2;
  char *__ptr;
  
  fputc(0x22,(FILE *)out);
  uVar2 = 0;
  do {
    if (astr->len <= uVar2) {
      fputc(0x22,(FILE *)out);
      return;
    }
    bVar1 = astr->str[uVar2];
    switch(bVar1) {
    case 7:
      __ptr = "\\a";
      break;
    case 8:
switchD_0026180d_caseD_8:
      if ((byte)(bVar1 - 0x20) < 0x5f) {
        fputc((uint)bVar1,(FILE *)out);
      }
      else {
        fprintf((FILE *)out,"\\x%02x");
      }
      goto LAB_00261880;
    case 9:
      __ptr = "\\t";
      break;
    case 10:
      __ptr = "\\n";
      break;
    case 0xb:
      __ptr = "\\v";
      break;
    case 0xc:
      __ptr = "\\f";
      break;
    case 0xd:
      __ptr = "\\r";
      break;
    default:
      if (bVar1 == 0x22) {
        __ptr = "\\\"";
      }
      else {
        if (bVar1 != 0x5c) goto switchD_0026180d_caseD_8;
        __ptr = "\\\\";
      }
    }
    fwrite(__ptr,2,1,(FILE *)out);
LAB_00261880:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void print_escaped_astr(FILE *out, struct astr *astr) {
	int i;
	fprintf(out, "\"");
	for (i = 0; i < astr->len; i++) {
		unsigned char c = astr->str[i];
		switch (c) {
			case '\\':
				fprintf(out, "\\\\");
				break;
			case '\"':
				fprintf(out, "\\\"");
				break;
			case '\n':
				fprintf(out, "\\n");
				break;
			case '\f':
				fprintf(out, "\\f");
				break;
			case '\t':
				fprintf(out, "\\t");
				break;
			case '\a':
				fprintf(out, "\\a");
				break;
			case '\v':
				fprintf(out, "\\v");
				break;
			case '\r':
				fprintf(out, "\\r");
				break;
			default:
				if (c >= 0x20 && c <= 0x7e) {
					fprintf(out, "%c", c);
				} else {
					fprintf(out, "\\x%02x", c);
				}
				break;
		}
	}
	fprintf(out, "\"");
}